

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O0

void __thiscall Edge::initWithObs(Edge *this,Vector2d *obs)

{
  size_type sVar1;
  double *pdVar2;
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  Index in_RDI;
  Vector2d vec;
  int i;
  int max_size;
  Vector2d back_beam;
  Vector2d front_beam;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffffe28;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe40;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffffe50;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
  *in_stack_fffffffffffffe58;
  int local_134;
  RealScalar local_130;
  RealScalar local_128;
  int local_11c;
  
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)in_stack_fffffffffffffe40);
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
            (in_stack_fffffffffffffe40,in_RDI,(Index)in_RSI);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>>::operator-
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_RSI,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)in_stack_fffffffffffffe28);
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)in_stack_fffffffffffffe40);
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
            (in_stack_fffffffffffffe40,in_RDI,(Index)in_RSI);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>>::operator-
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_RSI,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)in_stack_fffffffffffffe28);
  sVar1 = std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)0x143fae);
  local_11c = (int)sVar1 + -1;
  local_128 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm
                        (in_stack_fffffffffffffe28);
  local_130 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm
                        (in_stack_fffffffffffffe28);
  pdVar2 = std::min<double>(&local_128,&local_130);
  *(double *)(in_RDI + 0x50) = *pdVar2;
  for (local_134 = 1; local_134 < local_11c; local_134 = local_134 + 1) {
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::at(in_RSI,(size_type)in_stack_fffffffffffffe28);
    Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
              (in_stack_fffffffffffffe40,in_RDI,(Index)in_RSI);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>>::operator-
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ((Matrix<double,_2,_1,_0,_2,_1> *)in_RSI,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe40 =
         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm(in_stack_fffffffffffffe28);
    pdVar2 = std::min<double>((double *)&stack0xfffffffffffffe40,(double *)(in_RDI + 0x50));
    *(double *)(in_RDI + 0x50) = *pdVar2;
  }
  *(undefined1 *)(in_RDI + 0x58) = 1;
  return;
}

Assistant:

void Edge::initWithObs(Eigen::Vector2d obs) {
    LOG_CHECK("Init with obs, this address is: %x, size is %lu", this, this->size());
    Eigen::Vector2d front_beam = this->front().block<2, 1>(0, 0) - obs, back_beam = this->back().block<2, 1>(0, 0) - obs;
    int max_size = static_cast<int>(this->size()) - 1;
    min_dist = std::min(front_beam.norm(), back_beam.norm());
    for (int i = 1; i < max_size; i++) {
        Eigen::Vector2d vec = this->at(i).block<2, 1>(0, 0) - obs;
        min_dist = std::min(vec.norm(), min_dist);   
    }
    valid = true;
}